

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

find_result __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::find_child(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             *this,byte key_byte)

{
  reference this_00;
  pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
  pVar1;
  find_result fVar2;
  reference local_30;
  byte local_23;
  byte local_22;
  byte local_21;
  uchar child_i;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_20;
  byte key_byte_local;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *local_10;
  
  local_21 = key_byte;
  pbStack_20 = this;
  this_00 = std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                      (&this->child_indexes,(ulong)key_byte);
  local_22 = in_fake_critical_section<unsigned_char>::load(this_00);
  if (local_22 == 0xff) {
    this_local._0_1_ = 0xff;
    local_10 = (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                *)0x0;
  }
  else {
    local_23 = local_21;
    local_30 = std::
               array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_48UL>
               ::operator[](&(this->children).pointer_array,(ulong)local_22);
    pVar1 = std::
            make_pair<unsigned_char,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                      (&local_23,&local_30);
    local_10 = pVar1.second;
    this_local._0_1_ = pVar1.first;
  }
  fVar2._1_7_ = (undefined7)((ulong)local_10 >> 8);
  fVar2.first = (uchar)this_local;
  fVar2.second = local_10;
  return fVar2;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::find_result
  find_child(std::byte key_byte) noexcept {
    const auto child_i =
        child_indexes[static_cast<std::uint8_t>(key_byte)].load();
    if (child_i != empty_child) {
      return std::make_pair(static_cast<std::uint8_t>(key_byte),
                            &children.pointer_array[child_i]);
    }
    return parent_class::child_not_found;
  }